

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O2

void __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::AlternativePass0
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this,int depth)

{
  bool bVar1;
  
  while( true ) {
    bVar1 = IsEndOfAlternative(this);
    if (bVar1) break;
    TermPass0(this,depth);
  }
  return;
}

Assistant:

void Parser<P, IsLiteral>::AlternativePass0(int depth)
    {
        while (!IsEndOfAlternative())
            TermPass0(depth);
    }